

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_AMD_performance_monitor(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_AMD_performance_monitor != 0) {
    glad_glGetPerfMonitorGroupsAMD =
         (PFNGLGETPERFMONITORGROUPSAMDPROC)(*in_RDI)("glGetPerfMonitorGroupsAMD");
    glad_glGetPerfMonitorCountersAMD =
         (PFNGLGETPERFMONITORCOUNTERSAMDPROC)(*in_RDI)("glGetPerfMonitorCountersAMD");
    glad_glGetPerfMonitorGroupStringAMD =
         (PFNGLGETPERFMONITORGROUPSTRINGAMDPROC)(*in_RDI)("glGetPerfMonitorGroupStringAMD");
    glad_glGetPerfMonitorCounterStringAMD =
         (PFNGLGETPERFMONITORCOUNTERSTRINGAMDPROC)(*in_RDI)("glGetPerfMonitorCounterStringAMD");
    glad_glGetPerfMonitorCounterInfoAMD =
         (PFNGLGETPERFMONITORCOUNTERINFOAMDPROC)(*in_RDI)("glGetPerfMonitorCounterInfoAMD");
    glad_glGenPerfMonitorsAMD = (PFNGLGENPERFMONITORSAMDPROC)(*in_RDI)("glGenPerfMonitorsAMD");
    glad_glDeletePerfMonitorsAMD =
         (PFNGLDELETEPERFMONITORSAMDPROC)(*in_RDI)("glDeletePerfMonitorsAMD");
    glad_glSelectPerfMonitorCountersAMD =
         (PFNGLSELECTPERFMONITORCOUNTERSAMDPROC)(*in_RDI)("glSelectPerfMonitorCountersAMD");
    glad_glBeginPerfMonitorAMD = (PFNGLBEGINPERFMONITORAMDPROC)(*in_RDI)("glBeginPerfMonitorAMD");
    glad_glEndPerfMonitorAMD = (PFNGLENDPERFMONITORAMDPROC)(*in_RDI)("glEndPerfMonitorAMD");
    glad_glGetPerfMonitorCounterDataAMD =
         (PFNGLGETPERFMONITORCOUNTERDATAAMDPROC)(*in_RDI)("glGetPerfMonitorCounterDataAMD");
  }
  return;
}

Assistant:

static void load_GL_AMD_performance_monitor(GLADloadproc load) {
	if(!GLAD_GL_AMD_performance_monitor) return;
	glad_glGetPerfMonitorGroupsAMD = (PFNGLGETPERFMONITORGROUPSAMDPROC)load("glGetPerfMonitorGroupsAMD");
	glad_glGetPerfMonitorCountersAMD = (PFNGLGETPERFMONITORCOUNTERSAMDPROC)load("glGetPerfMonitorCountersAMD");
	glad_glGetPerfMonitorGroupStringAMD = (PFNGLGETPERFMONITORGROUPSTRINGAMDPROC)load("glGetPerfMonitorGroupStringAMD");
	glad_glGetPerfMonitorCounterStringAMD = (PFNGLGETPERFMONITORCOUNTERSTRINGAMDPROC)load("glGetPerfMonitorCounterStringAMD");
	glad_glGetPerfMonitorCounterInfoAMD = (PFNGLGETPERFMONITORCOUNTERINFOAMDPROC)load("glGetPerfMonitorCounterInfoAMD");
	glad_glGenPerfMonitorsAMD = (PFNGLGENPERFMONITORSAMDPROC)load("glGenPerfMonitorsAMD");
	glad_glDeletePerfMonitorsAMD = (PFNGLDELETEPERFMONITORSAMDPROC)load("glDeletePerfMonitorsAMD");
	glad_glSelectPerfMonitorCountersAMD = (PFNGLSELECTPERFMONITORCOUNTERSAMDPROC)load("glSelectPerfMonitorCountersAMD");
	glad_glBeginPerfMonitorAMD = (PFNGLBEGINPERFMONITORAMDPROC)load("glBeginPerfMonitorAMD");
	glad_glEndPerfMonitorAMD = (PFNGLENDPERFMONITORAMDPROC)load("glEndPerfMonitorAMD");
	glad_glGetPerfMonitorCounterDataAMD = (PFNGLGETPERFMONITORCOUNTERDATAAMDPROC)load("glGetPerfMonitorCounterDataAMD");
}